

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O1

void __thiscall QHttpThreadDelegate::~QHttpThreadDelegate(QHttpThreadDelegate *this)

{
  int *piVar1;
  QSslConfiguration *this_00;
  long lVar2;
  undefined8 *puVar3;
  
  *(undefined ***)this = &PTR_metaObject_002d3e20;
  if (*(long **)(this + 0x150) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x150) + 0x20))();
  }
  lVar2 = QThreadStorageData::get();
  if ((lVar2 != 0) && (*(long *)(this + 0x148) != 0)) {
    puVar3 = (undefined8 *)QThreadStorageData::get();
    if (puVar3 == (undefined8 *)0x0) {
      puVar3 = (undefined8 *)QThreadStorageData::set(&connections);
    }
    QNetworkAccessCache::releaseEntry((QNetworkAccessCache *)*puVar3,(QByteArray *)(this + 0x138));
  }
  piVar1 = *(int **)(this + 0x138);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x138),1,0x10);
    }
  }
  QSharedPointer<char>::deref(*(Data **)(this + 0x128));
  QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)(this + 0x118));
  QHttp1Configuration::~QHttp1Configuration((QHttp1Configuration *)(this + 0x110));
  piVar1 = *(int **)(this + 0xf8);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0xf8),2,0x10);
    }
  }
  piVar1 = *(int **)(this + 0xc0);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0xc0),2,0x10);
    }
  }
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)(this + 0xb0));
  piVar1 = *(int **)(this + 0x98);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x98),1,0x10);
    }
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x80) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x80));
  }
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)(this + 0x70));
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)(this + 0x68));
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60));
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x50) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x50));
  }
  QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)(this + 0x20));
  this_00 = *(QSslConfiguration **)(this + 0x18);
  if (this_00 != (QSslConfiguration *)0x0) {
    QSslConfiguration::~QSslConfiguration(this_00);
    operator_delete(this_00,8);
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QHttpThreadDelegate::~QHttpThreadDelegate()
{
    // It could be that the main thread has asked us to shut down, so we need to delete the HTTP reply
    if (httpReply) {
        delete httpReply;
    }

    // Get the object cache that stores our QHttpNetworkConnection objects
    // and release the entry for this QHttpNetworkConnection
    if (connections.hasLocalData() && !cacheKey.isEmpty()) {
        connections.localData()->releaseEntry(cacheKey);
    }
}